

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_remove_interface
               (oonf_rfc5444_interface *interf,oonf_rfc5444_interface_listener *listener)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_rfc5444_target *t_it;
  oonf_rfc5444_target *target;
  oonf_rfc5444_interface_listener *listener_local;
  oonf_rfc5444_interface *interf_local;
  
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(2,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x279,0,0,
             "Remove interface %s from protocol %s (refcount was %d)",interf,interf->protocol,
             interf->_refcount);
  }
  if (interf->_refcount < 2) {
    if ((listener != (oonf_rfc5444_interface_listener *)0x0) &&
       (listener->interface != (oonf_rfc5444_interface *)0x0)) {
      plVar1 = (listener->_node).prev;
      plVar2 = (listener->_node).next;
      plVar1->next = plVar2;
      plVar2->prev = plVar1;
      (listener->_node).prev = (list_entity *)0x0;
      (listener->_node).next = (list_entity *)0x0;
      listener->interface = (oonf_rfc5444_interface *)0x0;
    }
    plVar1 = (interf->_target_tree).list_head.next;
    t_it = (oonf_rfc5444_target *)(plVar1 + -10);
    plVar1 = plVar1->next;
    while( true ) {
      __tempptr = plVar1 + -10;
      if ((t_it->_node).list.prev == (interf->_target_tree).list_head.prev) break;
      _destroy_target(t_it);
      t_it = (oonf_rfc5444_target *)__tempptr;
      plVar1 = plVar1->next;
    }
    if (interf->multicast4 != (oonf_rfc5444_target *)0x0) {
      _destroy_target(interf->multicast4);
    }
    if (interf->multicast6 != (oonf_rfc5444_target *)0x0) {
      _destroy_target(interf->multicast6);
    }
    avl_remove(&interf->protocol->_interface_tree);
    oonf_rfc5444_remove_protocol(interf->protocol);
    oonf_packet_remove_managed(&interf->_socket,false);
    oonf_packet_free_managed_config(&interf->_socket_config);
    oonf_class_free(&_interface_memcookie,interf);
  }
  else {
    interf->_refcount = interf->_refcount + -1;
  }
  return;
}

Assistant:

void
oonf_rfc5444_remove_interface(struct oonf_rfc5444_interface *interf, struct oonf_rfc5444_interface_listener *listener) {
  struct oonf_rfc5444_target *target, *t_it;

  OONF_INFO(LOG_RFC5444, "Remove interface %s from protocol %s (refcount was %d)", interf->name, interf->protocol->name,
    interf->_refcount);

  if (interf->_refcount > 1) {
    /* still users left for this interface */
    interf->_refcount--;
    return;
  }

  if (listener != NULL && listener->interface != NULL) {
    list_remove(&listener->_node);
    listener->interface = NULL;
  }

  /* remove all remaining targets */
  avl_for_each_element_safe(&interf->_target_tree, target, _node, t_it) {
    _destroy_target(target);
  }

  /* remove multicast targets */
  if (interf->multicast4) {
    _destroy_target(interf->multicast4);
  }
  if (interf->multicast6) {
    _destroy_target(interf->multicast6);
  }

  /* remove from protocol tree */
  avl_remove(&interf->protocol->_interface_tree, &interf->_node);

  /* decrease protocol refcount */
  oonf_rfc5444_remove_protocol(interf->protocol);

  /* remove socket */
  oonf_packet_remove_managed(&interf->_socket, false);

  /* cleanup configuration copy */
  oonf_packet_free_managed_config(&interf->_socket_config);

  /* free memory */
  oonf_class_free(&_interface_memcookie, interf);
}